

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  Op OVar1;
  IRContext *this_00;
  bool bVar2;
  uint32_t local_7c;
  iterator local_78;
  undefined8 local_70;
  SmallVector<unsigned_int,_2UL> local_68;
  uint32_t local_40;
  uint32_t local_3c;
  uint32_t new_member_idx;
  uint32_t orig_member_idx;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  local_30;
  iterator live_members;
  uint32_t type_id;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  OVar1 = Instruction::opcode(inst);
  bVar2 = true;
  if (OVar1 != OpMemberName) {
    OVar1 = Instruction::opcode(inst);
    bVar2 = OVar1 == OpMemberDecorate;
  }
  if (!bVar2) {
    __assert_fail("inst->opcode() == spv::Op::OpMemberName || inst->opcode() == spv::Op::OpMemberDecorate"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x16e,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction *)"
                 );
  }
  live_members.
  super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
  ._M_cur._4_4_ = Instruction::GetSingleWordInOperand(inst,0);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->used_members_,
              (key_type *)
              ((long)&live_members.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      ._M_cur + 4));
  _new_member_idx =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
       ::end(&this->used_members_);
  bVar2 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                      *)&new_member_idx);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    local_3c = Instruction::GetSingleWordInOperand(inst,1);
    local_7c = GetNewMemberIndex(this,live_members.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                      ._M_cur._4_4_,local_3c);
    local_40 = local_7c;
    if (local_7c == 0xffffffff) {
      this_00 = Pass::context((Pass *)this);
      IRContext::KillInst(this_00,inst);
      this_local._7_1_ = true;
    }
    else if (local_7c == local_3c) {
      this_local._7_1_ = false;
    }
    else {
      local_78 = &local_7c;
      local_70 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_78;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_68,init_list);
      Instruction::SetInOperand(inst,1,&local_68);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_68);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EliminateDeadMembersPass::UpdateOpMemberNameOrDecorate(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpMemberName ||
         inst->opcode() == spv::Op::OpMemberDecorate);

  uint32_t type_id = inst->GetSingleWordInOperand(0);
  auto live_members = used_members_.find(type_id);
  if (live_members == used_members_.end()) {
    return false;
  }

  uint32_t orig_member_idx = inst->GetSingleWordInOperand(1);
  uint32_t new_member_idx = GetNewMemberIndex(type_id, orig_member_idx);

  if (new_member_idx == kRemovedMember) {
    context()->KillInst(inst);
    return true;
  }

  if (new_member_idx == orig_member_idx) {
    return false;
  }

  inst->SetInOperand(1, {new_member_idx});
  return true;
}